

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_vliet.c
# Opt level: O1

void swap_gauss(float *c,float *b,int w,int h,double s)

{
  long lVar1;
  float fVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  double dVar24;
  double dVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double sum;
  double M [9];
  double local_148;
  undefined1 local_128 [64];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  
  if (3.556 <= s) {
    dVar24 = s * 0.9804 + -0.9772023999999999;
  }
  else {
    dVar24 = (s * 0.0561 + 0.5784) * s + -0.2568;
  }
  dVar28 = dVar24 * dVar24;
  dStack_50 = 1.0 / ((dVar24 * 2.21566 + 3.2037296485000004 + dVar28) * (dVar24 + 1.1668));
  dVar29 = -dVar28 * (dVar24 * 3.0 + 3.38246) * dStack_50;
  dVar30 = dVar24 * dVar28 * dStack_50;
  local_68._8_4_ = SUB84(dVar29,0);
  local_68._0_8_ = dVar30;
  local_68._12_4_ = (int)((ulong)dVar29 >> 0x20);
  dVar28 = (dVar28 * 3.0 + dVar24 * 6.76492 + 5.788961736500001) * dVar24 * dStack_50;
  dStack_50 = dStack_50 * 3.7381117538698008;
  local_98._8_4_ = SUB84(dStack_50,0);
  local_98._0_8_ = dStack_50;
  local_98._12_4_ = (int)((ulong)dStack_50 >> 0x20);
  dVar24 = dStack_50 * dStack_50;
  uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
  uVar11 = (ulong)(uint)w;
  local_58 = dVar28;
  local_48 = dVar28;
  local_40 = dVar29;
  dStack_38 = dVar30;
  if (0 < h) {
    local_78._8_4_ = SUB84(dVar24,0);
    local_78._0_8_ = dVar24;
    local_78._12_4_ = uVar26;
    dVar4 = 1.0 / dStack_50;
    dVar27 = 1.0 / (1.0 - (dVar29 + dVar28 + dVar30));
    local_88._8_4_ = SUB84(dVar24,0);
    local_88._0_8_ = dVar28;
    local_88._12_4_ = uVar26;
    iVar16 = 0;
    pfVar23 = b;
    do {
      local_148 = (double)*c * dVar4;
      fVar2 = c[w + -1];
      if (w < 1) {
        local_128._8_4_ = SUB84(local_148,0);
        local_128._0_8_ = local_148;
        local_128._12_4_ = (int)((ulong)local_148 >> 0x20);
      }
      else {
        lVar8 = 0;
        lVar13 = 0;
        dVar32 = local_148;
        dVar5 = local_148;
        dVar25 = local_148;
        do {
          local_148 = dVar25;
          dVar25 = dVar5;
          dVar5 = dVar32 * dVar30 + local_148 * dVar29 + dVar25 * dVar28 + (double)c[lVar13];
          pfVar23[lVar13] = (float)dVar5;
          lVar13 = lVar13 + 1;
          lVar8 = lVar8 + -4;
          dVar32 = local_148;
        } while (w != (int)lVar13);
        local_128._8_4_ = SUB84(dVar25,0);
        local_128._0_8_ = dVar5;
        local_128._12_4_ = (int)((ulong)dVar25 >> 0x20);
        c = (float *)((long)c - lVar8);
        pfVar23 = (float *)((long)pfVar23 - lVar8);
      }
      TriggsM((double *)local_68,&local_e8);
      dVar32 = (double)fVar2 * dVar27;
      dVar5 = dVar32 * dVar27;
      local_148 = local_148 - dVar32;
      dVar31 = (double)local_128._0_8_ - dVar32;
      dVar32 = (double)local_128._8_8_ - dVar32;
      dVar25 = (dStack_e0 * dVar32 + local_d8 * local_148 + local_e8 * dVar31 + dVar5) * dVar24;
      pfVar23[-1] = (float)dVar25;
      if (1 < w) {
        iVar7 = w + -1;
        dVar6 = (dVar5 + dVar31 * local_b8 + local_148 * local_a8 + dVar32 * dStack_b0) *
                (double)local_78._0_8_;
        dVar5 = (dVar5 + dVar31 * local_d0 + local_148 * dStack_c0 + dVar32 * local_c8) *
                (double)local_78._8_8_;
        do {
          dVar32 = dVar25;
          dVar25 = dVar6 * dVar30 + (double)pfVar23[-2] * (double)local_88._8_8_ +
                   dVar5 * dVar29 + dVar32 * (double)local_88._0_8_;
          pfVar23[-2] = (float)dVar25;
          pfVar23 = pfVar23 + -1;
          iVar7 = iVar7 + -1;
          dVar6 = dVar5;
          dVar5 = dVar32;
        } while (0 < iVar7);
      }
      pfVar23 = pfVar23 + (long)w + -1;
      iVar16 = iVar16 + 1;
    } while (iVar16 != h);
  }
  lVar21 = (long)w << 3;
  lVar8 = g_malloc(lVar21);
  lVar13 = g_malloc(lVar21);
  lVar9 = g_malloc(lVar21);
  lVar10 = g_malloc(lVar21);
  lVar21 = g_malloc(lVar21);
  dVar5 = dStack_38;
  dVar27 = local_40;
  dVar4 = local_48;
  pfVar23 = b;
  if (0 < w) {
    lVar14 = 0;
    do {
      dVar32 = (double)*(float *)((long)b + lVar14) * (1.0 / (double)local_98._0_8_);
      *(double *)(lVar9 + lVar14 * 2) = dVar32;
      *(double *)(lVar10 + lVar14 * 2) = dVar32;
      *(double *)(lVar21 + lVar14 * 2) = dVar32;
      lVar14 = lVar14 + 4;
    } while (uVar11 * 4 - lVar14 != 0);
    pfVar23 = (float *)(lVar14 + (long)b);
  }
  pfVar23 = pfVar23 + (h + -2) * w;
  if (0 < w) {
    lVar14 = 0;
    do {
      *(double *)(lVar8 + lVar14 * 2) =
           (double)*(float *)((long)pfVar23 + lVar14) * (1.0 / (1.0 - (dVar28 + dVar29 + dVar30)));
      lVar14 = lVar14 + 4;
    } while (uVar11 * 4 - lVar14 != 0);
    pfVar23 = (float *)((long)pfVar23 + lVar14);
  }
  lVar14 = lVar10;
  lVar20 = lVar21;
  lVar22 = lVar9;
  if (0 < h) {
    pfVar23 = pfVar23 + -(long)(h * w);
    iVar16 = 0;
    lVar17 = lVar21;
    lVar12 = lVar10;
    lVar15 = lVar13;
    do {
      lVar14 = lVar22;
      lVar22 = lVar15;
      lVar20 = lVar12;
      lVar15 = lVar17;
      if (0 < w) {
        lVar17 = 0;
        do {
          dVar32 = *(double *)(lVar15 + lVar17 * 2) * dVar30 +
                   *(double *)(lVar20 + lVar17 * 2) * dVar29 +
                   *(double *)(lVar14 + lVar17 * 2) * dVar28 +
                   (double)*(float *)((long)pfVar23 + lVar17);
          *(float *)((long)b + lVar17) = (float)dVar32;
          *(double *)(lVar22 + lVar17 * 2) = dVar32;
          lVar17 = lVar17 + 4;
        } while (uVar11 << 2 != lVar17);
        pfVar23 = (float *)((long)pfVar23 + lVar17);
        b = (float *)((long)b + lVar17);
      }
      iVar16 = iVar16 + 1;
      lVar17 = lVar20;
      lVar12 = lVar14;
    } while (iVar16 != h);
  }
  TriggsM((double *)local_68,&local_e8);
  uVar11 = (ulong)(w - 1);
  pfVar23 = b;
  if (0 < w) {
    lVar17 = lVar20 + uVar11 * 8;
    lVar12 = lVar14 + uVar11 * 8;
    lVar15 = lVar22 + uVar11 * 8;
    lVar19 = 0;
    do {
      dVar28 = *(double *)(lVar8 + uVar11 * 8 + lVar19 * 8);
      dVar29 = dVar28 * (1.0 / (1.0 - (dVar5 + dVar4 + dVar27)));
      dVar32 = *(double *)(lVar15 + lVar19 * 8) - dVar28;
      dVar30 = *(double *)(lVar12 + lVar19 * 8) - dVar28;
      dVar28 = *(double *)(lVar17 + lVar19 * 8) - dVar28;
      dVar25 = (local_d8 * dVar28 + local_e8 * dVar32 + dVar29 + dStack_e0 * dVar30) * dVar24;
      pfVar23 = pfVar23 + -1;
      b[lVar19 + -1] = (float)dVar25;
      *(double *)(lVar15 + lVar19 * 8) = dVar25;
      *(double *)(lVar12 + lVar19 * 8) =
           (dStack_c0 * dVar28 + local_c8 * dVar30 + local_d0 * dVar32 + dVar29) * dVar24;
      *(double *)(lVar17 + lVar19 * 8) =
           (local_a8 * dVar28 + dVar32 * local_b8 + dVar29 + dStack_b0 * dVar30) * dVar24;
      lVar1 = uVar11 + 1 + lVar19;
      lVar19 = lVar19 + -1;
    } while (lVar1 != 1 && -1 < lVar1 + -1);
  }
  if (1 < h) {
    lVar12 = uVar11 * 8;
    lVar17 = lVar8;
    iVar16 = h + -2;
    do {
      lVar19 = lVar17;
      lVar15 = lVar14;
      pfVar18 = pfVar23;
      if (0 < w) {
        lVar14 = 0;
        do {
          pfVar18 = pfVar18 + -1;
          dVar28 = *(double *)(lVar20 + lVar12 + lVar14 * 8) * dVar5 +
                   *(double *)(lVar22 + lVar12 + lVar14 * 8) * dVar4 +
                   *(double *)(lVar15 + lVar12 + lVar14 * 8) * dVar27 +
                   dVar24 * (double)pfVar23[lVar14 + -1];
          pfVar23[lVar14 + -1] = (float)dVar28;
          *(double *)(lVar19 + lVar12 + lVar14 * 8) = dVar28;
          lVar17 = uVar11 + 1 + lVar14;
          lVar14 = lVar14 + -1;
        } while (lVar17 != 1 && -1 < lVar17 + -1);
      }
      pfVar23 = pfVar18;
      bVar3 = 0 < iVar16;
      lVar14 = lVar22;
      lVar17 = lVar20;
      lVar20 = lVar15;
      lVar22 = lVar19;
      iVar16 = iVar16 + -1;
    } while (bVar3);
  }
  g_free(lVar13);
  g_free(lVar9);
  g_free(lVar10);
  g_free(lVar21);
  g_free(lVar8);
  return;
}

Assistant:

void swap_gauss(SRCTYPE *c, DSTTYPE *b, int w, int h, double s) {
    double filter[7];

    /* calculate filter coefficients of x-direction */
    YvVfilterCoef(s, filter);
    /* filter in the x-direction */
    xline(c, b, w, h, filter);
    /* calculate filter coefficients in tanp-direction */
    /* YvVfilterCoef(s, filter); */
    yline(b, b, w, h, filter);
}